

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyLink.h
# Opt level: O2

void __thiscall btMultibodyLink::btMultibodyLink(btMultibodyLink *this)

{
  btMatrix3x3 *pbVar1;
  btVector3 *pbVar2;
  
  this->m_parent = -1;
  (this->m_zeroRotParentToThis).super_btQuadWord.m_floats[0] = 0.0;
  (this->m_zeroRotParentToThis).super_btQuadWord.m_floats[1] = 0.0;
  (this->m_zeroRotParentToThis).super_btQuadWord.m_floats[2] = 0.0;
  (this->m_zeroRotParentToThis).super_btQuadWord.m_floats[3] = 1.0;
  memset(&this->m_absFrameTotVelocity,0,0x100);
  (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0] = 0.0;
  (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1] = 0.0;
  (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2] = 0.0;
  (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3] = 1.0;
  this->m_collider = (btMultiBodyLinkCollider *)0x0;
  this->m_flags = 0;
  this->m_dofCount = 0;
  this->m_posVarCount = 0;
  this->m_jointType = eInvalid;
  this->m_jointFeedback = (btMultiBodyJointFeedback *)0x0;
  this->m_linkName = (char *)0x0;
  this->m_jointName = (char *)0x0;
  this->m_mass = 1.0;
  (this->m_inertiaLocal).m_floats[0] = 1.0;
  (this->m_inertiaLocal).m_floats[1] = 1.0;
  (this->m_inertiaLocal).m_floats[2] = 1.0;
  (this->m_inertiaLocal).m_floats[3] = 0.0;
  this->m_axes[0].m_topVec.m_floats[0] = 0.0;
  this->m_axes[0].m_topVec.m_floats[1] = 0.0;
  this->m_axes[0].m_topVec.m_floats[2] = 0.0;
  this->m_axes[0].m_topVec.m_floats[3] = 0.0;
  this->m_axes[0].m_bottomVec.m_floats[0] = 1.0;
  this->m_axes[0].m_bottomVec.m_floats[2] = 0.0;
  this->m_jointPos[6] = 0.0;
  this->m_jointPos[4] = 0.0;
  this->m_jointPos[5] = 0.0;
  (this->m_dVector).m_floats[0] = 0.0;
  (this->m_dVector).m_floats[1] = 0.0;
  (this->m_dVector).m_floats[2] = 0.0;
  (this->m_dVector).m_floats[3] = 0.0;
  (this->m_eVector).m_floats[0] = 0.0;
  (this->m_eVector).m_floats[1] = 0.0;
  (this->m_eVector).m_floats[2] = 0.0;
  (this->m_eVector).m_floats[3] = 0.0;
  (this->m_cachedRVector).m_floats[0] = 0.0;
  (this->m_cachedRVector).m_floats[1] = 0.0;
  (this->m_cachedRVector).m_floats[2] = 0.0;
  (this->m_cachedRVector).m_floats[3] = 0.0;
  (this->m_appliedForce).m_floats[0] = 0.0;
  (this->m_appliedForce).m_floats[1] = 0.0;
  (this->m_appliedForce).m_floats[2] = 0.0;
  (this->m_appliedForce).m_floats[3] = 0.0;
  (this->m_appliedTorque).m_floats[0] = 0.0;
  (this->m_appliedTorque).m_floats[1] = 0.0;
  (this->m_appliedTorque).m_floats[2] = 0.0;
  (this->m_appliedTorque).m_floats[3] = 0.0;
  this->m_jointPos[0] = 0.0;
  this->m_jointPos[1] = 0.0;
  this->m_jointPos[2] = 0.0;
  this->m_jointPos[3] = 1.0;
  this->m_jointTorque[0] = 0.0;
  this->m_jointTorque[1] = 0.0;
  this->m_jointTorque[2] = 0.0;
  this->m_jointTorque[3] = 0.0;
  this->m_jointTorque[4] = 0.0;
  this->m_jointTorque[5] = 0.0;
  (this->m_cachedWorldTransform).m_basis.m_el[0].m_floats[0] = 1.0;
  pbVar1 = &(this->m_cachedWorldTransform).m_basis;
  pbVar1->m_el[0].m_floats[1] = 0.0;
  pbVar1->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_cachedWorldTransform).m_basis.m_el[0].m_floats + 3) = 0;
  (this->m_cachedWorldTransform).m_basis.m_el[1].m_floats[1] = 1.0;
  pbVar2 = (this->m_cachedWorldTransform).m_basis.m_el;
  pbVar2[1].m_floats[2] = 0.0;
  pbVar2[1].m_floats[3] = 0.0;
  pbVar1 = &(this->m_cachedWorldTransform).m_basis;
  pbVar1->m_el[2].m_floats[0] = 0.0;
  pbVar1->m_el[2].m_floats[1] = 0.0;
  (this->m_cachedWorldTransform).m_basis.m_el[2].m_floats[2] = 1.0;
  *(undefined8 *)((this->m_cachedWorldTransform).m_basis.m_el[2].m_floats + 3) = 0;
  (this->m_cachedWorldTransform).m_origin.m_floats[1] = 0.0;
  (this->m_cachedWorldTransform).m_origin.m_floats[2] = 0.0;
  (this->m_cachedWorldTransform).m_origin.m_floats[3] = 0.0;
  return;
}

Assistant:

btMultibodyLink()
		: 	m_mass(1),
			m_parent(-1),
			m_zeroRotParentToThis(0, 0, 0, 1),
			m_cachedRotParentToThis(0, 0, 0, 1),
			m_collider(0),
			m_flags(0),
			m_dofCount(0),
			m_posVarCount(0),
			m_jointType(btMultibodyLink::eInvalid),
			m_jointFeedback(0),
			m_linkName(0),
			m_jointName(0)
	{
		
		m_inertiaLocal.setValue(1, 1, 1);
		setAxisTop(0, 0., 0., 0.);
		setAxisBottom(0, 1., 0., 0.);
		m_dVector.setValue(0, 0, 0);
		m_eVector.setValue(0, 0, 0);
		m_cachedRVector.setValue(0, 0, 0);
		m_appliedForce.setValue( 0, 0, 0);
		m_appliedTorque.setValue(0, 0, 0);
		//		
		m_jointPos[0] = m_jointPos[1] = m_jointPos[2] = m_jointPos[4] = m_jointPos[5] = m_jointPos[6] = 0.f;
		m_jointPos[3] = 1.f;			//"quat.w"
		m_jointTorque[0] = m_jointTorque[1] = m_jointTorque[2] = m_jointTorque[3] = m_jointTorque[4] = m_jointTorque[5] = 0.f;
		m_cachedWorldTransform.setIdentity();
	}